

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
pbrt::ParseFiles(pbrt *this,SceneRepresentation *scene,
                span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                filenames)

{
  int iVar1;
  long lVar2;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t_1;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  _Head_base<0UL,_pbrt::Tokenizer_*,_false> local_b8;
  SceneRepresentation *local_b0;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> local_a8;
  undefined1 local_a0 [8];
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_b0 = (SceneRepresentation *)this;
  if (filenames.ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 8),"-","",filenames.n);
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = (char *)0x0;
    local_40 = std::
               _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
               ::_M_manager;
    Tokenizer::CreateFromFile
              ((Tokenizer *)&local_b8,(string *)(local_a0 + 8),
               (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_b8._M_head_impl != (Tokenizer *)0x0) {
      local_a0 = (undefined1  [8])local_b8._M_head_impl;
      local_b8._M_head_impl = (Tokenizer *)0x0;
      parse(local_b0,(unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_a0)
      ;
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_a0);
    }
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)&local_b8);
  }
  else {
    lVar2 = (long)filenames.ptr << 5;
    do {
      iVar1 = std::__cxx11::string::compare((char *)scene);
      if (iVar1 != 0) {
        SetSearchDirectory((string *)scene);
      }
      local_78._0_8_ = 0;
      local_78._8_8_ = (pointer)0x0;
      local_60 = std::
                 _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:865:21)>
                 ::_M_manager;
      Tokenizer::CreateFromFile
                ((Tokenizer *)(local_a0 + 8),(string *)scene,
                 (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_98._M_dataplus._M_p != (pointer)0x0) {
        local_a8._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>.
        _M_t.super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
        super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl =
             (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
             (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
             local_98._M_dataplus._M_p;
        local_98._M_dataplus._M_p = (pointer)0x0;
        parse(local_b0,&local_a8);
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                  (&local_a8);
      }
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 (local_a0 + 8));
      scene = (SceneRepresentation *)((long)scene + 0x20);
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void ParseFiles(SceneRepresentation *scene, pstd::span<const std::string> filenames) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // Process scene description
    if (filenames.empty()) {
        // Parse scene from standard input
        std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile("-", tokError);
        if (t)
            parse(scene, std::move(t));
    } else {
        // Parse scene from input files
        for (const std::string &fn : filenames) {
            if (fn != "-")
                SetSearchDirectory(fn);

            std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile(fn, tokError);
            if (t)
                parse(scene, std::move(t));
        }
    }
}